

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core.cc
# Opt level: O2

void WebRtcAecm_CalcEnergies
               (AecmCore *aecm,uint16_t *far_spectrum,int16_t far_q,uint32_t nearEner,
               int32_t *echoEst)

{
  int16_t *piVar1;
  bool bVar2;
  int16_t iVar3;
  ushort inVal;
  int16_t iVar4;
  int16_t iVar5;
  long lVar6;
  undefined6 in_register_00000012;
  ushort uVar7;
  int iVar8;
  bool bVar9;
  uint32_t tmpFar;
  uint32_t tmpStored;
  uint32_t tmpAdapt;
  
  tmpAdapt = 0;
  tmpStored = 0;
  tmpFar = 0;
  memmove(aecm->nearLogEnergy + 1,aecm->nearLogEnergy,0x7e);
  iVar3 = LogOfEnergyInQ8(nearEner,(int)aecm->dfaNoisyQDomain);
  aecm->nearLogEnergy[0] = iVar3;
  (*WebRtcAecm_CalcLinearEnergies)(aecm,far_spectrum,echoEst,&tmpFar,&tmpAdapt,&tmpStored);
  memmove(aecm->echoAdaptLogEnergy + 1,aecm->echoAdaptLogEnergy,0x7e);
  memmove(aecm->echoStoredLogEnergy + 1,aecm->echoStoredLogEnergy,0x7e);
  iVar8 = (int)CONCAT62(in_register_00000012,far_q);
  inVal = LogOfEnergyInQ8(tmpFar,iVar8);
  aecm->farLogEnergy = inVal;
  iVar8 = iVar8 + 0xc;
  iVar3 = LogOfEnergyInQ8(tmpAdapt,iVar8);
  aecm->echoAdaptLogEnergy[0] = iVar3;
  iVar4 = LogOfEnergyInQ8(tmpStored,iVar8);
  aecm->echoStoredLogEnergy[0] = iVar4;
  if ((short)inVal < 0x402) {
    uVar7 = aecm->farEnergyVAD;
  }
  else {
    bVar9 = aecm->startupState == 0;
    bVar2 = !bVar9;
    iVar4 = WebRtcAecm_AsymFilt(aecm->farEnergyMin,inVal,(ushort)bVar2 * 3 + 8,bVar9 ^ 3);
    aecm->farEnergyMin = iVar4;
    iVar5 = WebRtcAecm_AsymFilt(aecm->farEnergyMax,inVal,(ushort)bVar2 * 2 + 2,0xb);
    aecm->farEnergyMax = iVar5;
    aecm->farEnergyMaxMin = iVar5 - iVar4;
    iVar8 = ((uint)(ushort)(0xa00U - iVar4) * 0xe6 >> 9) + 0xe6;
    if ((short)(0xa00U - iVar4) < 1) {
      iVar8 = 0xe6;
    }
    if (bVar2 && aecm->vadUpdateCount < 0x401) {
      uVar7 = aecm->farEnergyVAD;
      if ((short)inVal < (short)uVar7) {
        uVar7 = uVar7 + (short)((iVar8 + (uint)inVal) - (uint)uVar7 >> 6);
        aecm->farEnergyVAD = uVar7;
        aecm->vadUpdateCount = 0;
      }
      else {
        aecm->vadUpdateCount = aecm->vadUpdateCount + 1;
      }
    }
    else {
      uVar7 = iVar4 + (short)iVar8;
      aecm->farEnergyVAD = uVar7;
    }
    aecm->farEnergyMSE = uVar7 + 0x100;
  }
  if ((short)uVar7 < (short)inVal) {
    if ((aecm->startupState == 0) || (0x3a1 < aecm->farEnergyMaxMin)) {
      aecm->currentVADValue = 1;
    }
    else if (aecm->currentVADValue == 0) {
      return;
    }
    if ((aecm->firstVAD != 0) && (aecm->firstVAD = 0, aecm->nearLogEnergy[0] < iVar3)) {
      piVar1 = aecm->channelAdapt16;
      for (lVar6 = 0; lVar6 != 0x41; lVar6 = lVar6 + 1) {
        piVar1[lVar6] = piVar1[lVar6] >> 3;
      }
      aecm->echoAdaptLogEnergy[0] = aecm->echoAdaptLogEnergy[0] + -0x300;
      aecm->firstVAD = 1;
    }
  }
  else {
    aecm->currentVADValue = 0;
  }
  return;
}

Assistant:

void WebRtcAecm_CalcEnergies(AecmCore* aecm,
                             const uint16_t* far_spectrum,
                             const int16_t far_q,
                             const uint32_t nearEner,
                             int32_t* echoEst) {
    // Local variables
    uint32_t tmpAdapt = 0;
    uint32_t tmpStored = 0;
    uint32_t tmpFar = 0;

    int i;

    int16_t tmp16;
    int16_t increase_max_shifts = 4;
    int16_t decrease_max_shifts = 11;
    int16_t increase_min_shifts = 11;
    int16_t decrease_min_shifts = 3;

    // Get log of near end energy and store in buffer

    // Shift buffer
    memmove(aecm->nearLogEnergy + 1, aecm->nearLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));

    // Logarithm of integrated magnitude spectrum (nearEner)
    aecm->nearLogEnergy[0] = LogOfEnergyInQ8(nearEner, aecm->dfaNoisyQDomain);

    WebRtcAecm_CalcLinearEnergies(aecm, far_spectrum, echoEst, &tmpFar, &tmpAdapt, &tmpStored);

    // Shift buffers
    memmove(aecm->echoAdaptLogEnergy + 1, aecm->echoAdaptLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));
    memmove(aecm->echoStoredLogEnergy + 1, aecm->echoStoredLogEnergy,
            sizeof(int16_t) * (MAX_BUF_LEN - 1));

    // Logarithm of delayed far end energy
    aecm->farLogEnergy = LogOfEnergyInQ8(tmpFar, far_q);

    // Logarithm of estimated echo energy through adapted channel
    aecm->echoAdaptLogEnergy[0] = LogOfEnergyInQ8(tmpAdapt,
                                                  RESOLUTION_CHANNEL16 + far_q);

    // Logarithm of estimated echo energy through stored channel
    aecm->echoStoredLogEnergy[0] =
        LogOfEnergyInQ8(tmpStored, RESOLUTION_CHANNEL16 + far_q);

    // Update farend energy levels (min, max, vad, mse)
    if (aecm->farLogEnergy > FAR_ENERGY_MIN)
    {
        if (aecm->startupState == 0)
        {
            increase_max_shifts = 2;
            decrease_min_shifts = 2;
            increase_min_shifts = 8;
        }

        aecm->farEnergyMin = WebRtcAecm_AsymFilt(aecm->farEnergyMin, aecm->farLogEnergy,
                                                 increase_min_shifts, decrease_min_shifts);
        aecm->farEnergyMax = WebRtcAecm_AsymFilt(aecm->farEnergyMax, aecm->farLogEnergy,
                                                 increase_max_shifts, decrease_max_shifts);
        aecm->farEnergyMaxMin = (aecm->farEnergyMax - aecm->farEnergyMin);

        // Dynamic VAD region size
        tmp16 = 2560 - aecm->farEnergyMin;
        if (tmp16 > 0)
        {
          tmp16 = (int16_t)((tmp16 * FAR_ENERGY_VAD_REGION) >> 9);
        } else
        {
            tmp16 = 0;
        }
        tmp16 += FAR_ENERGY_VAD_REGION;

        if ((aecm->startupState == 0) | (aecm->vadUpdateCount > 1024))
        {
            // In startup phase or VAD update halted
            aecm->farEnergyVAD = aecm->farEnergyMin + tmp16;
        } else
        {
            if (aecm->farEnergyVAD > aecm->farLogEnergy)
            {
                aecm->farEnergyVAD +=
                    (aecm->farLogEnergy + tmp16 - aecm->farEnergyVAD) >> 6;
                aecm->vadUpdateCount = 0;
            } else
            {
                aecm->vadUpdateCount++;
            }
        }
        // Put MSE threshold higher than VAD
        aecm->farEnergyMSE = aecm->farEnergyVAD + (1 << 8);
    }

    // Update VAD variables
    if (aecm->farLogEnergy > aecm->farEnergyVAD)
    {
        if ((aecm->startupState == 0) | (aecm->farEnergyMaxMin > FAR_ENERGY_DIFF))
        {
            // We are in startup or have significant dynamics in input speech level
            aecm->currentVADValue = 1;
        }
    } else
    {
        aecm->currentVADValue = 0;
    }
    if ((aecm->currentVADValue) && (aecm->firstVAD))
    {
        aecm->firstVAD = 0;
        if (aecm->echoAdaptLogEnergy[0] > aecm->nearLogEnergy[0])
        {
            // The estimated echo has higher energy than the near end signal.
            // This means that the initialization was too aggressive. Scale
            // down by a factor 8
            for (i = 0; i < PART_LEN1; i++)
            {
                aecm->channelAdapt16[i] >>= 3;
            }
            // Compensate the adapted echo energy level accordingly.
            aecm->echoAdaptLogEnergy[0] -= (3 << 8);
            aecm->firstVAD = 1;
        }
    }
}